

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AhoCorasickPlus.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
AhoCorasickPlus::findAll
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,AhoCorasickPlus *this,
          string *text,bool keep)

{
  AC_TEXT_t *text_00;
  iterator __position;
  bool bVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  undefined3 in_register_00000009;
  ulong uVar5;
  AC_MATCH_t local_48;
  
  text_00 = this->m_acText;
  text_00->astring = (text->_M_dataplus)._M_p;
  text_00->length = text->_M_string_length;
  ac_trie_settext(this->m_automata,text_00,CONCAT31(in_register_00000009,keep));
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (ac_trie_findnext(&local_48,this->m_automata), sVar3 = local_48.size, local_48.size != 0) {
    lVar2 = CONCAT44(local_48.patterns._4_4_,(int)local_48.patterns);
    uVar4 = 0;
    uVar5 = 1;
    do {
      local_48.patterns._0_4_ = *(int *)(lVar2 + 0x20 + uVar4 * 0x30);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,__position,(int *)&local_48);
      }
      else {
        *__position._M_current = (int)local_48.patterns;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      bVar1 = uVar5 < sVar3;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> AhoCorasickPlus::findAll (const std::string& text, bool keep)
{
  this->search(text, keep);

  std::vector<int> IDs;
  AC_MATCH_t matchp;
  unsigned int j;

  while ((matchp = ac_trie_findnext (m_automata)).size)
  {
      for (j = 0; j < matchp.size; j++)
      {
          // Add the id to our vector
          IDs.push_back(matchp.patterns[j].id.u.number);
      }
  }

  return IDs;
}